

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O0

Image * Image_Function_Helper::Rotate
                  (RotateForm4 rotate,Image *in,uint32_t x,uint32_t y,double centerX,double centerY,
                  uint32_t width,uint32_t height,double angle)

{
  undefined4 in_ECX;
  ImageTemplate<unsigned_char> *in_RDX;
  code *in_RSI;
  ImageTemplate<unsigned_char> *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined4 in_stack_00000008;
  Image *out;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff90;
  uint32_t in_stack_ffffffffffffff98;
  uint32_t in_stack_ffffffffffffff9c;
  ImageTemplate<unsigned_char> *pIVar1;
  uint8_t in_stack_ffffffffffffffae;
  uint8_t in_stack_ffffffffffffffaf;
  uint32_t in_stack_ffffffffffffffb0;
  uint32_t in_stack_ffffffffffffffb4;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 uVar2;
  
  pIVar1 = in_RDI;
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_RDI,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,
             (uint32_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff90);
  Image_Function::VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffff90);
  uVar2 = 0;
  PenguinV_Image::ImageTemplate<unsigned_char>::colorCount(in_RDX);
  PenguinV_Image::ImageTemplate<unsigned_char>::generate
            ((ImageTemplate<unsigned_char> *)CONCAT17(uVar2,in_stack_ffffffffffffffb8),
             in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffaf,
             in_stack_ffffffffffffffae);
  (*in_RSI)(in_XMM0_Qa,in_XMM1_Qa,in_XMM0_Qa,in_XMM1_Qa,in_XMM2_Qa,in_RDX,in_ECX,in_R8D,pIVar1,0,0,
            in_R9D,in_stack_00000008);
  return in_RDI;
}

Assistant:

Image Rotate( FunctionTable::RotateForm4 rotate,
                  const Image & in, uint32_t x, uint32_t y, double centerX, double centerY, uint32_t width, uint32_t height, double angle )
    {
        Image_Function::ParameterValidation( in, x, y, width, height );
        Image_Function::VerifyGrayScaleImage( in );

        Image out = in.generate( width, height, in.colorCount() );

        rotate( in, x, y, centerX, centerY, out, 0, 0, centerX, centerY, width, height, angle );

        return out;
    }